

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQObjectPtr *in_RDI;
  SQInteger n;
  SQObjectPtr other;
  SQObjectPtr res;
  SQInteger size;
  SQArray *a;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQVM *in_stack_ffffffffffffff70;
  SQObjectPtr *obj;
  SQObjectPtr *this;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar1;
  SQInteger in_stack_ffffffffffffff90;
  SQObjectValue in_stack_ffffffffffffff98;
  SQBool raiseerror;
  SQBool in_stack_ffffffffffffffa8;
  SQObjectValue in_stack_ffffffffffffffb0;
  HSQUIRRELVM in_stack_ffffffffffffffb8;
  SQObjectPtr local_38;
  SQInteger local_28;
  SQObjectValue local_20;
  SQObject *local_18;
  SQObjectPtr *local_10;
  SQInteger local_8;
  
  local_10 = in_RDI;
  local_18 = &stack_get(in_stack_ffffffffffffff70,(SQInteger)in_stack_ffffffffffffff68)->
              super_SQObject;
  local_20 = local_18->_unVal;
  local_28 = SQArray::Size((SQArray *)0x11e864);
  if (local_28 == 0) {
    return 0;
  }
  this = &local_38;
  SQObjectPtr::SQObjectPtr(this);
  SQArray::Get(in_stack_ffffffffffffff98.pArray,in_stack_ffffffffffffff90,
               (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (1 < local_28) {
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8);
    for (raiseerror = 1; (long)raiseerror < local_28; raiseerror = raiseerror + 1) {
      SQArray::Get(in_stack_ffffffffffffff98.pArray,in_stack_ffffffffffffff90,
                   (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      obj = local_10;
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff90,local_18);
      SQVM::Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
      SQVM::Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      SQVM::Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff70 =
           (SQVM *)sq_call(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0.nInteger,
                           in_stack_ffffffffffffffa8,raiseerror);
      if ((long)in_stack_ffffffffffffff70 < 0) {
        local_8 = -1;
        iVar1 = 1;
        goto LAB_0011ea2d;
      }
      in_stack_ffffffffffffff68 =
           SQVM::GetUp(in_stack_ffffffffffffff70,(SQInteger)in_stack_ffffffffffffff68);
      SQObjectPtr::operator=(this,obj);
      SQVM::Pop((SQVM *)0x11ea0e);
    }
    iVar1 = 0;
LAB_0011ea2d:
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
    if (iVar1 != 0) goto LAB_0011ea77;
  }
  SQVM::Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_8 = 1;
LAB_0011ea77:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  return local_8;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    if(size == 0) {
        return 0;
    }
    SQObjectPtr res;
    a->Get(0,res);
    if(size > 1) {
        SQObjectPtr other;
        for(SQInteger n = 1; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
    }
    v->Push(res);
    return 1;
}